

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkAttachmentDescription2 * __thiscall
Fossilize::StateRecorder::Impl::copy<VkAttachmentDescription2>
          (Impl *this,VkAttachmentDescription2 *src,size_t count,ScratchAllocator *alloc)

{
  VkAttachmentDescription2 *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkAttachmentDescription2 *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkAttachmentDescription2>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkAttachmentDescription2_const*,VkAttachmentDescription2*>
                (src,src + count,(VkAttachmentDescription2 *)this_local);
    }
  }
  return (VkAttachmentDescription2 *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}